

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_concat(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int dim)

{
  ggml_type type;
  ggml_tensor *pgVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  int line;
  int64_t ne [4];
  int64_t local_38 [4];
  
  if ((uint)dim < 4) {
    type = a->type;
    if (type == b->type) {
      lVar2 = 0;
      do {
        if ((ulong)(uint)dim << 3 == lVar2) {
          lVar4 = *(long *)((long)b->ne + lVar2) + *(long *)((long)a->ne + lVar2);
        }
        else {
          lVar4 = *(long *)((long)a->ne + lVar2);
          if (lVar4 != *(long *)((long)b->ne + lVar2)) {
            pcVar3 = "a->ne[d] == b->ne[d]";
            line = 0x930;
            goto LAB_0011adee;
          }
        }
        *(long *)((long)local_38 + lVar2) = lVar4;
        lVar2 = lVar2 + 8;
        if (lVar2 == 0x20) {
          pgVar1 = ggml_new_tensor_impl(ctx,type,4,local_38,(ggml_tensor *)0x0,0);
          pgVar1->op_params[0] = dim;
          pgVar1->op = GGML_OP_CONCAT;
          pgVar1->src[0] = a;
          pgVar1->src[1] = b;
          return pgVar1;
        }
      } while( true );
    }
    pcVar3 = "a->type == b->type";
    line = 0x928;
  }
  else {
    pcVar3 = "dim >= 0 && dim < GGML_MAX_DIMS";
    line = 0x927;
  }
LAB_0011adee:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,line,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

struct ggml_tensor * ggml_concat(
    struct ggml_context * ctx,
    struct ggml_tensor  * a,
    struct ggml_tensor  * b,
    int                   dim) {
    GGML_ASSERT(dim >= 0 && dim < GGML_MAX_DIMS);
    GGML_ASSERT(a->type == b->type);

    int64_t ne[GGML_MAX_DIMS];
    for (int d = 0; d < GGML_MAX_DIMS; ++d) {
        if (d == dim) {
            ne[d] = a->ne[d] + b->ne[d];
            continue;
        }
        GGML_ASSERT(a->ne[d] == b->ne[d]);
        ne[d] = a->ne[d];
    }

    struct ggml_tensor * result = ggml_new_tensor(ctx, a->type, GGML_MAX_DIMS, ne);

    ggml_set_op_params_i32(result, 0, dim);

    result->op     = GGML_OP_CONCAT;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}